

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  TestProperty *pTVar1;
  Message *pMVar2;
  int i;
  string local_90;
  string local_70;
  pointer local_50;
  string *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  allocator<char> local_31;
  
  local_48 = __return_storage_ptr__;
  Message::Message((Message *)&local_40);
  for (i = 0; i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                               (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                     _vptr_TestEventListener) >> 6); i = i + 1) {
    pTVar1 = TestResult::GetTestProperty((TestResult *)this,i);
    std::operator<<((ostream *)(local_40._M_head_impl + 0x10)," ");
    local_50 = (pTVar1->key_)._M_dataplus._M_p;
    pMVar2 = Message::operator<<((Message *)&local_40,&local_50);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x12b4dc);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x12d87f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(pTVar1->value_)._M_dataplus._M_p,&local_31);
    EscapeXmlAttribute(&local_90,&local_70);
    pMVar2 = Message::operator<<(pMVar2,&local_90);
    Message::operator<<(pMVar2,(char (*) [2])0x12d87f);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  StringStreamToString(local_48,local_40._M_head_impl);
  if (local_40._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return local_48;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}